

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::Exception::Context>::disposeImpl
          (HeapDisposer<kj::Exception::Context> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::Exception::Context> *this_local;
  
  if (pointer != (void *)0x0) {
    Exception::Context::~Context((Context *)pointer);
    operator_delete(pointer,0x38);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }